

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxExpression::EmitCompare
          (FxExpression *this,VMFunctionBuilder *build,bool invert,
          TArray<unsigned_long,_unsigned_long> *patchspots_yes,
          TArray<unsigned_long,_unsigned_long> *patchspots_no)

{
  uint uVar1;
  uint uVar2;
  uint extraout_var;
  size_t sVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  
  uVar2 = (*this->_vptr_FxExpression[9])(this,build,CONCAT71(in_register_00000011,invert));
  if ((CONCAT44(extraout_var,uVar2) & 0x1ff000000) != 0x1000000) {
    __assert_fail("op.RegType != REGT_NIL && op.RegCount == 1 && !op.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x13c,
                  "virtual void FxExpression::EmitCompare(VMFunctionBuilder *, bool, TArray<size_t> &, TArray<size_t> &)"
                 );
  }
  bVar4 = (byte)(uVar2 >> 0x10);
  if (3 < bVar4) {
    sVar3 = VMFunctionBuilder::Emit(build,0x44,0);
    TArray<unsigned_long,_unsigned_long>::Grow(patchspots_no,1);
    uVar1 = patchspots_no->Count;
    patchspots_no->Array[uVar1] = sVar3;
    patchspots_no->Count = uVar1 + 1;
    if (3 < bVar4 || (extraout_var & 0x100) != 0) {
      return;
    }
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar2) >> 0x10) & 3),uVar2 & 0xffff,
               1);
    return;
  }
  (*(code *)(&DAT_00623214 + *(int *)(&DAT_00623214 + (((ulong)uVar2 & 0xff0000) >> 0x10) * 4)))();
  return;
}

Assistant:

void FxExpression::EmitCompare(VMFunctionBuilder *build, bool invert, TArray<size_t> &patchspots_yes, TArray<size_t> &patchspots_no)
{
	ExpEmit op = Emit(build);
	ExpEmit i;
	assert(op.RegType != REGT_NIL && op.RegCount == 1 && !op.Konst);
	switch (op.RegType)
	{
	case REGT_INT:
		build->Emit(OP_EQ_K, !invert, op.RegNum, build->GetConstantInt(0));
		break;

	case REGT_FLOAT:
		build->Emit(OP_EQF_K, !invert, op.RegNum, build->GetConstantFloat(0));
		break;

	case REGT_POINTER:
		build->Emit(OP_EQA_K, !invert, op.RegNum, build->GetConstantAddress(0, ATAG_GENERIC));
		break;

	case REGT_STRING:
		i = ExpEmit(build, REGT_INT);
		build->Emit(OP_LENS, i.RegNum, op.RegNum);
		build->Emit(OP_EQ_K, !invert, i.RegNum, build->GetConstantInt(0));
		i.Free(build);
		break;

	default:
		break;
	}
	patchspots_no.Push(build->Emit(OP_JMP, 0));
	op.Free(build);
}